

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::ColumnIndex::~ColumnIndex(ColumnIndex *this)

{
  ~ColumnIndex(this);
  operator_delete(this);
  return;
}

Assistant:

ColumnIndex::~ColumnIndex() noexcept {
}